

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmesa_context.c
# Opt level: O0

void makeContextCurrentOSMesa(_GLFWwindow *window)

{
  int iVar1;
  void *pvVar2;
  long in_RDI;
  int height;
  int width;
  int *in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  if (in_RDI != 0) {
    _glfwPlatformGetFramebufferSize
              ((_GLFWwindow *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffe8,(int *)0x122369);
    if (((*(long *)(in_RDI + 0x2b0) == 0) || (in_stack_fffffffffffffff4 != *(int *)(in_RDI + 0x2a8))
        ) || (in_stack_fffffffffffffff0 != *(int *)(in_RDI + 0x2ac))) {
      free(*(void **)(in_RDI + 0x2b0));
      pvVar2 = calloc(4,(long)in_stack_fffffffffffffff4 * (long)in_stack_fffffffffffffff0);
      *(void **)(in_RDI + 0x2b0) = pvVar2;
      *(int *)(in_RDI + 0x2a8) = in_stack_fffffffffffffff4;
      *(int *)(in_RDI + 0x2ac) = in_stack_fffffffffffffff0;
    }
    iVar1 = (*_glfw.osmesa.MakeCurrent)
                      (*(OSMesaContext *)(in_RDI + 0x2a0),*(void **)(in_RDI + 0x2b0),0x1401,
                       in_stack_fffffffffffffff4,in_stack_fffffffffffffff0);
    if (iVar1 == 0) {
      _glfwInputError(0x10008,"OSMesa: Failed to make context current");
      return;
    }
  }
  _glfwPlatformSetTls((_GLFWtls *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                      in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void makeContextCurrentOSMesa(_GLFWwindow* window)
{
    if (window)
    {
        int width, height;
        _glfwPlatformGetFramebufferSize(window, &width, &height);

        // Check to see if we need to allocate a new buffer
        if ((window->context.osmesa.buffer == NULL) ||
            (width != window->context.osmesa.width) ||
            (height != window->context.osmesa.height))
        {
            free(window->context.osmesa.buffer);

            // Allocate the new buffer (width * height * 8-bit RGBA)
            window->context.osmesa.buffer = calloc(4, (size_t) width * height);
            window->context.osmesa.width  = width;
            window->context.osmesa.height = height;
        }

        if (!OSMesaMakeCurrent(window->context.osmesa.handle,
                               window->context.osmesa.buffer,
                               GL_UNSIGNED_BYTE,
                               width, height))
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "OSMesa: Failed to make context current");
            return;
        }
    }

    _glfwPlatformSetTls(&_glfw.contextSlot, window);
}